

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_vexp_fun.c
# Opt level: O3

void ex_fact(t_expr *e,long argc,ex_ex *argv,ex_ex *optr)

{
  long lVar1;
  int iVar2;
  t_float *ptVar3;
  float *pfVar4;
  int iVar5;
  float fVar6;
  
  lVar1 = argv->ex_type;
  if (lVar1 - 0xeU < 2) {
    if (optr->ex_type == 0xf) {
      ptVar3 = (optr->ex_cont).v_vec;
    }
    else {
      optr->ex_type = 0xf;
      ptVar3 = (t_float *)malloc((long)e->exp_vsize << 2);
      (optr->ex_cont).v_vec = ptVar3;
    }
    iVar2 = e->exp_vsize;
    if (iVar2 != 0) {
      pfVar4 = (argv->ex_cont).v_vec;
      do {
        iVar5 = (int)*pfVar4;
        fVar6 = 1.0;
        if (0 < iVar5) {
          fVar6 = 1.0;
          do {
            fVar6 = fVar6 * (float)iVar5;
            iVar5 = iVar5 + -1;
          } while (iVar5 != 0);
        }
        iVar2 = iVar2 + -1;
        pfVar4 = pfVar4 + 1;
        *ptVar3 = fVar6;
        ptVar3 = ptVar3 + 1;
      } while (iVar2 != 0);
    }
  }
  else {
    if (lVar1 == 2) {
      if (optr->ex_type == 0xf) {
        ptVar3 = (optr->ex_cont).v_vec;
        iVar2 = (int)(argv->ex_cont).v_flt;
        fVar6 = 1.0;
        if (0 < iVar2) {
          do {
            fVar6 = fVar6 * (float)iVar2;
            iVar2 = iVar2 + -1;
          } while (iVar2 != 0);
        }
        goto LAB_001a032b;
      }
      optr->ex_type = 2;
      iVar2 = (int)(argv->ex_cont).v_flt;
      fVar6 = 1.0;
      if (0 < iVar2) {
        do {
          fVar6 = fVar6 * (float)iVar2;
          iVar2 = iVar2 + -1;
        } while (iVar2 != 0);
      }
    }
    else {
      if (lVar1 != 1) {
        pd_error(e,"expr: FUNV_EVAL_UNARY(%d): bad left type %ld\n",0x3bf);
        return;
      }
      if (optr->ex_type == 0xf) {
        ptVar3 = (optr->ex_cont).v_vec;
        iVar2 = *(int *)&argv->ex_cont;
        fVar6 = 1.0;
        if (0 < iVar2) {
          do {
            fVar6 = fVar6 * (float)iVar2;
            iVar2 = iVar2 + -1;
          } while (iVar2 != 0);
        }
LAB_001a032b:
        ex_mkvector(ptVar3,fVar6,e->exp_vsize);
        return;
      }
      optr->ex_type = 2;
      iVar2 = *(int *)&argv->ex_cont;
      fVar6 = 1.0;
      if (0 < iVar2) {
        do {
          fVar6 = fVar6 * (float)iVar2;
          iVar2 = iVar2 + -1;
        } while (iVar2 != 0);
      }
    }
    (optr->ex_cont).v_flt = fVar6;
  }
  return;
}

Assistant:

static void
ex_fact(t_expr *e, long int argc, struct ex_ex *argv, struct ex_ex *optr)
{
        struct ex_ex *left;
        t_float *op; /* output pointer */
        t_float *lp, *rp;         /* left and right vector pointers */
        t_float scalar;
        int j;

        left = argv++;

        FUNC_EVAL_UNARY(left, ex_dofact,  (int), optr, 1);
}